

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lest_cpp03.hpp
# Opt level: O1

result * __thiscall
lest::expression_lhs<nonstd::sv_lite::basic_string_view<char,std::char_traits<char>>const&>::
operator<(result *__return_storage_ptr__,
         expression_lhs<nonstd::sv_lite::basic_string_view<char,std::char_traits<char>>const&> *this
         ,basic_string_view<char,_std::char_traits<char>_> *rhs)

{
  lest *this_00;
  ulong uVar1;
  ulong uVar2;
  int iVar3;
  ulong __n;
  basic_string_view<char,_std::char_traits<char>_> *in_R8;
  undefined1 *local_d8;
  long local_d0;
  undefined1 local_c8 [16];
  undefined1 *local_b8;
  long local_b0;
  undefined1 local_a8 [16];
  bool local_98;
  undefined1 *local_90;
  long local_88;
  undefined1 local_80 [16];
  basic_string_view<char,_std::char_traits<char>_> local_70;
  char local_60 [16];
  string local_50;
  
  this_00 = *(lest **)this;
  uVar1 = *(ulong *)(this_00 + 8);
  uVar2 = rhs->size_;
  __n = uVar1;
  if (uVar2 < uVar1) {
    __n = uVar2;
  }
  iVar3 = memcmp(*(void **)this_00,rhs->data_,__n);
  if ((iVar3 == 0) && (iVar3 = 0, uVar1 != uVar2)) {
    iVar3 = -(uint)(uVar1 < uVar2);
  }
  local_d8 = local_c8;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_d8,"<","");
  local_70.data_ = local_60;
  std::__cxx11::string::_M_construct<char*>((string *)&local_70,local_d8,local_d8 + local_d0);
  to_string<nonstd::sv_lite::basic_string_view<char,std::char_traits<char>>,nonstd::sv_lite::basic_string_view<char,std::char_traits<char>>>
            (&local_50,this_00,&local_70,(string *)rhs,in_R8);
  local_b8 = local_a8;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_b8,local_50._M_dataplus._M_p,
             local_50._M_dataplus._M_p + local_50._M_string_length);
  local_98 = SUB41((uint)iVar3 >> 0x1f,0);
  local_90 = local_80;
  std::__cxx11::string::_M_construct<char*>((string *)&local_90,local_b8,local_b8 + local_b0);
  __return_storage_ptr__->passed = local_98;
  (__return_storage_ptr__->decomposition)._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->decomposition).field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&__return_storage_ptr__->decomposition,local_90,local_90 + local_88);
  if (local_90 != local_80) {
    operator_delete(local_90);
  }
  if (local_b8 != local_a8) {
    operator_delete(local_b8);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p);
  }
  if (local_70.data_ != local_60) {
    operator_delete(local_70.data_);
  }
  if (local_d8 != local_c8) {
    operator_delete(local_d8);
  }
  return __return_storage_ptr__;
}

Assistant:

result operator> ( R const & rhs ) { return result( lhs >  rhs, to_string( lhs, ">" , rhs ) ); }